

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O3

uint I_MakeRNGSeed(void)

{
  int __fd;
  time_t tVar1;
  uint seed;
  undefined1 local_14 [4];
  
  tVar1 = time((time_t *)0x0);
  __fd = open("/dev/urandom",0);
  if ((__fd < 0) && (__fd = open("/dev/random",0), __fd < 0)) {
    return (uint)tVar1;
  }
  read(__fd,local_14,4);
  close(__fd);
  return (uint)tVar1;
}

Assistant:

unsigned int I_MakeRNGSeed()
{
	unsigned int seed;
	int file;

	// Try reading from /dev/urandom first, then /dev/random, then
	// if all else fails, use a crappy seed from time().
	seed = time(NULL);
	file = open("/dev/urandom", O_RDONLY);
	if (file < 0)
	{
		file = open("/dev/random", O_RDONLY);
	}
	if (file >= 0)
	{
		read(file, &seed, sizeof(seed));
		close(file);
	}
	return seed;
}